

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O0

void makePreviewImage(Array2D<Imf_3_2::Rgba> *pixels,int width,int height,
                     Array2D<Imf_3_2::PreviewRgba> *previewPixels,int *previewWidth,
                     int *previewHeight)

{
  uchar extraout_AL;
  uchar extraout_AL_00;
  uchar extraout_AL_01;
  Rgba *pRVar1;
  PreviewRgba *pPVar2;
  Array2D<Imf_3_2::PreviewRgba> *in_RCX;
  int in_EDX;
  int in_ESI;
  Array2D<Imf_3_2::Rgba> *in_RDI;
  int *in_R8;
  int *in_R9;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  PreviewRgba *outPixel;
  Rgba *inPixel;
  long in_stack_00000010;
  int x;
  int y;
  int N;
  int local_34;
  int local_30;
  
  *in_R8 = in_ESI / 8;
  *in_R9 = in_EDX / 8;
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::resizeErase
            ((Array2D<Imf_3_2::PreviewRgba> *)previewHeight,_y,in_stack_00000010);
  for (local_30 = 0; local_30 < *in_R9; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < *in_R8; local_34 = local_34 + 1) {
      pRVar1 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](in_RDI,(long)(local_30 << 3));
      pRVar1 = pRVar1 + (local_34 << 3);
      pPVar2 = Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::operator[](in_RCX,(long)local_30);
      pPVar2 = pPVar2 + local_34;
      fVar3 = Imath_3_2::half::operator_cast_to_float(&pRVar1->r);
      gamma((double)CONCAT44(extraout_XMM0_Db,fVar3));
      pPVar2->r = extraout_AL;
      fVar3 = Imath_3_2::half::operator_cast_to_float(&pRVar1->r);
      gamma((double)CONCAT44(extraout_XMM0_Db_00,fVar3));
      pPVar2->g = extraout_AL_00;
      fVar3 = Imath_3_2::half::operator_cast_to_float(&pRVar1->r);
      gamma((double)CONCAT44(extraout_XMM0_Db_01,fVar3));
      pPVar2->b = extraout_AL_01;
      fVar3 = Imath_3_2::half::operator_cast_to_float(&pRVar1->r);
      fVar3 = Imath_3_2::clamp<float>(fVar3 * 255.0,0.0,255.0);
      pPVar2->a = (uchar)(int)(fVar3 + 0.5);
    }
  }
  return;
}

Assistant:

void
makePreviewImage (
    const Array2D<Rgba>&  pixels,
    int                   width,
    int                   height,
    Array2D<PreviewRgba>& previewPixels,
    int&                  previewWidth,
    int&                  previewHeight)
{
    const int N = 8;

    previewWidth  = width / N;
    previewHeight = height / N;
    previewPixels.resizeErase (previewHeight, previewWidth);

    for (int y = 0; y < previewHeight; ++y)
    {
        for (int x = 0; x < previewWidth; ++x)
        {
            const Rgba&  inPixel  = pixels[y * N][x * N];
            PreviewRgba& outPixel = previewPixels[y][x];

            outPixel.r = gamma (inPixel.r);
            outPixel.g = gamma (inPixel.g);
            outPixel.b = gamma (inPixel.b);
            outPixel.a = int (
                IMATH_NAMESPACE::clamp (inPixel.a * 255.f, 0.f, 255.f) + 0.5f);
        }
    }
}